

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue json_parse_value(JSParseState *s)

{
  JSContext *ctx;
  JSAtomStruct *pJVar1;
  JSShape *sh;
  int iVar2;
  int iVar3;
  JSValueUnion JVar4;
  ulong uVar5;
  JSAtom v;
  JSValueUnion JVar6;
  uint uVar7;
  char cVar8;
  JSValueUnion JVar9;
  int64_t iVar10;
  ulong uVar11;
  JSValue v_00;
  JSValue JVar12;
  JSValue JVar13;
  JSValue JVar14;
  JSValue prop;
  
  ctx = s->ctx;
  iVar2 = (s->token).val;
  if (iVar2 < -0x56) {
    if (iVar2 == -0x80) {
      JVar4 = (JSValueUnion)*(JSValueUnion *)&(s->token).u;
      iVar10 = (s->token).u.str.str.tag;
LAB_0012f1f7:
      uVar11 = (ulong)JVar4.ptr >> 0x20;
      iVar2 = json_next_token(s);
    }
    else {
      if (iVar2 == -0x7f) {
        JVar4 = (JSValueUnion)*(JSValueUnion *)&(s->token).u;
        iVar10 = (s->token).u.str.str.tag;
        if (0xfffffff4 < (uint)iVar10) {
          *(int *)JVar4.ptr = *JVar4.ptr + 1;
        }
        goto LAB_0012f1f7;
      }
      if ((iVar2 != -0x7d) || (uVar7 = (s->token).u.ident.atom - 1, 2 < uVar7)) {
LAB_0012f24e:
        js_parse_error(s,"unexpected token: \'%.*s\'",
                       (ulong)(uint)(*(int *)&s->buf_ptr - (int)(s->token).ptr));
        goto LAB_0012f26d;
      }
      iVar10 = *(int64_t *)(&DAT_0017dce0 + (ulong)uVar7 * 8);
      JVar4._4_4_ = 0;
      JVar4.int32 = *(uint *)(&DAT_0017dcf8 + (ulong)uVar7 * 4);
      iVar2 = json_next_token(s);
      uVar11 = 0;
    }
    JVar12.tag = iVar10;
    JVar12.u.float64 = JVar4.float64;
    if (iVar2 == 0) {
LAB_0012f497:
      iVar10 = JVar12.tag;
      uVar11 = uVar11 << 0x20;
      uVar5 = (ulong)JVar12.u.ptr & 0xffffffff;
      goto LAB_0012f49d;
    }
  }
  else if (iVar2 == -0x56) {
    js_parse_error(s,"unexpected end of input");
LAB_0012f26d:
    JVar12 = (JSValue)(ZEXT816(2) << 0x40);
    uVar11 = 0;
  }
  else {
    if (iVar2 == 0x5b) {
      iVar2 = json_next_token(s);
      cVar8 = '\x03';
      if (iVar2 == 0) {
        sh = ctx->array_shape;
        (sh->header).ref_count = (sh->header).ref_count + 1;
        JVar13 = JS_NewObjectFromShape(ctx,sh,2);
        JVar4 = JVar13.u;
        uVar11 = (ulong)JVar4.ptr >> 0x20;
        if ((int)JVar13.tag != 6) {
          if ((s->token).val == 0x5d) {
LAB_0012f432:
            iVar2 = json_parse_expect(s,0x5d);
            JVar6.float64 = 0.0;
            cVar8 = (iVar2 != 0) * '\x03';
          }
          else {
            JVar12 = json_parse_value(s);
            JVar6 = JVar12.u;
            if ((int)JVar12.tag != 6) {
              JVar9.float64 = 0.0;
              do {
                iVar2 = JVar9.int32;
                JVar6.float64 = (double)JVar9.float64;
                if (-1 < iVar2) {
                  JVar6 = JVar9;
                }
                iVar10 = 7;
                if (-1 < iVar2) {
                  iVar10 = 0;
                }
                prop.tag = iVar10;
                prop.u.float64 = JVar6.float64;
                iVar3 = JS_DefinePropertyValueValue(ctx,JVar13,prop,JVar12,7);
                JVar6.float64 = 0.0;
                if (iVar3 < 0) break;
                if ((s->token).val != 0x2c) goto LAB_0012f432;
                iVar3 = json_next_token(s);
                JVar6.float64 = 0.0;
                if (iVar3 != 0) break;
                if ((s->ext_json != 0) && ((s->token).val == 0x5d)) goto LAB_0012f432;
                JVar12 = json_parse_value(s);
                JVar6 = JVar12.u;
                JVar9._0_4_ = iVar2 + 1;
                JVar9._4_4_ = 0;
              } while ((int)JVar12.tag != 6);
            }
          }
          JVar13.tag = JVar13.tag;
          JVar13.u.float64 = JVar6.float64;
        }
      }
      else {
        JVar4.float64 = 0.0;
        JVar13 = (JSValue)(ZEXT816(2) << 0x40);
        uVar11 = 0;
      }
      iVar10 = JVar13.tag;
      JVar12.tag = iVar10;
      JVar12.u.float64 = JVar4.float64;
    }
    else {
      if (iVar2 != 0x7b) goto LAB_0012f24e;
      iVar2 = json_next_token(s);
      cVar8 = '\x03';
      if (iVar2 == 0) {
        JVar12 = JS_NewObjectProtoClass(ctx,ctx->class_proto[1],1);
        uVar11 = (ulong)JVar12.u.ptr >> 0x20;
        if ((int)JVar12.tag == 6) {
LAB_0012f2e8:
          cVar8 = '\x03';
        }
        else {
          while ((s->token).val != 0x7d) {
            do {
              iVar2 = (s->token).val;
              if (iVar2 == -0x7f) {
                v = JS_ValueToAtom(ctx,(s->token).u.str.str);
                if (v == 0) goto LAB_0012f2e8;
              }
              else {
                if ((iVar2 != -0x7d) || (s->ext_json == 0)) {
                  js_parse_error(s,"expecting property name");
                  goto LAB_0012f2e8;
                }
                v = (s->token).u.ident.atom;
                if (0xd1 < (long)(int)v) {
                  pJVar1 = ctx->rt->atom_array[(int)v];
                  (pJVar1->header).ref_count = (pJVar1->header).ref_count + 1;
                }
              }
              iVar2 = json_next_token(s);
              if (((iVar2 != 0) || (iVar2 = json_parse_expect(s,0x3a), iVar2 != 0)) ||
                 (JVar13 = json_parse_value(s), (int)JVar13.tag == 6)) {
                JS_FreeAtom(ctx,v);
                goto LAB_0012f2e8;
              }
              iVar2 = JS_DefinePropertyValue(ctx,JVar12,v,JVar13,7);
              JS_FreeAtom(ctx,v);
              if (iVar2 < 0) goto LAB_0012f2e8;
              if ((s->token).val != 0x2c) goto LAB_0012f44b;
              iVar2 = json_next_token(s);
              if (iVar2 != 0) goto LAB_0012f2e8;
            } while (s->ext_json == 0);
          }
LAB_0012f44b:
          iVar2 = json_parse_expect(s,0x7d);
          cVar8 = (iVar2 != 0) * '\x03';
        }
      }
      else {
        JVar12 = (JSValue)(ZEXT816(2) << 0x40);
        uVar11 = 0;
      }
      iVar10 = JVar12.tag;
    }
    if (cVar8 == '\0') goto LAB_0012f497;
    if (cVar8 != '\x03') {
      uVar5 = 0;
      uVar11 = 0;
      goto LAB_0012f49d;
    }
  }
  JVar4.ptr = (void *)((ulong)JVar12.u.ptr & 0xffffffff | uVar11 << 0x20);
  if ((0xfffffff4 < (uint)JVar12.tag) &&
     (iVar2 = *JVar4.ptr, *(int *)JVar4.ptr = iVar2 + -1, iVar2 < 2)) {
    v_00.tag = JVar12.tag;
    v_00.u.ptr = JVar4.ptr;
    __JS_FreeValueRT(ctx->rt,v_00);
  }
  iVar10 = 6;
  uVar5 = 0;
  uVar11 = 0;
LAB_0012f49d:
  JVar14.u.ptr = (void *)(uVar5 | uVar11);
  JVar14.tag = iVar10;
  return JVar14;
}

Assistant:

static JSValue json_parse_value(JSParseState *s)
{
    JSContext *ctx = s->ctx;
    JSValue val = JS_NULL;
    int ret;

    switch(s->token.val) {
    case '{':
        {
            JSValue prop_val;
            JSAtom prop_name;
            
            if (json_next_token(s))
                goto fail;
            val = JS_NewObject(ctx);
            if (JS_IsException(val))
                goto fail;
            if (s->token.val != '}') {
                for(;;) {
                    if (s->token.val == TOK_STRING) {
                        prop_name = JS_ValueToAtom(ctx, s->token.u.str.str);
                        if (prop_name == JS_ATOM_NULL)
                            goto fail;
                    } else if (s->ext_json && s->token.val == TOK_IDENT) {
                        prop_name = JS_DupAtom(ctx, s->token.u.ident.atom);
                    } else {
                        js_parse_error(s, "expecting property name");
                        goto fail;
                    }
                    if (json_next_token(s))
                        goto fail1;
                    if (json_parse_expect(s, ':'))
                        goto fail1;
                    prop_val = json_parse_value(s);
                    if (JS_IsException(prop_val)) {
                    fail1:
                        JS_FreeAtom(ctx, prop_name);
                        goto fail;
                    }
                    ret = JS_DefinePropertyValue(ctx, val, prop_name,
                                                 prop_val, JS_PROP_C_W_E);
                    JS_FreeAtom(ctx, prop_name);
                    if (ret < 0)
                        goto fail;

                    if (s->token.val != ',')
                        break;
                    if (json_next_token(s))
                        goto fail;
                    if (s->ext_json && s->token.val == '}')
                        break;
                }
            }
            if (json_parse_expect(s, '}'))
                goto fail;
        }
        break;
    case '[':
        {
            JSValue el;
            uint32_t idx;

            if (json_next_token(s))
                goto fail;
            val = JS_NewArray(ctx);
            if (JS_IsException(val))
                goto fail;
            if (s->token.val != ']') {
                idx = 0;
                for(;;) {
                    el = json_parse_value(s);
                    if (JS_IsException(el))
                        goto fail;
                    ret = JS_DefinePropertyValueUint32(ctx, val, idx, el, JS_PROP_C_W_E);
                    if (ret < 0)
                        goto fail;
                    if (s->token.val != ',')
                        break;
                    if (json_next_token(s))
                        goto fail;
                    idx++;
                    if (s->ext_json && s->token.val == ']')
                        break;
                }
            }
            if (json_parse_expect(s, ']'))
                goto fail;
        }
        break;
    case TOK_STRING:
        val = JS_DupValue(ctx, s->token.u.str.str);
        if (json_next_token(s))
            goto fail;
        break;
    case TOK_NUMBER:
        val = s->token.u.num.val;
        if (json_next_token(s))
            goto fail;
        break;
    case TOK_IDENT:
        if (s->token.u.ident.atom == JS_ATOM_false ||
            s->token.u.ident.atom == JS_ATOM_true) {
            val = JS_NewBool(ctx, (s->token.u.ident.atom == JS_ATOM_true));
        } else if (s->token.u.ident.atom == JS_ATOM_null) {
            val = JS_NULL;
        } else {
            goto def_token;
        }
        if (json_next_token(s))
            goto fail;
        break;
    default:
    def_token:
        if (s->token.val == TOK_EOF) {
            js_parse_error(s, "unexpected end of input");
        } else {
            js_parse_error(s, "unexpected token: '%.*s'",
                           (int)(s->buf_ptr - s->token.ptr), s->token.ptr);
        }
        goto fail;
    }
    return val;
 fail:
    JS_FreeValue(ctx, val);
    return JS_EXCEPTION;
}